

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_rs_generator.cc
# Opt level: O0

string * __thiscall
t_rs_generator::rust_namespace_abi_cxx11_
          (string *__return_storage_ptr__,t_rs_generator *this,t_type *ttype)

{
  bool bVar1;
  t_program *ptVar2;
  string *psVar3;
  string *__rhs;
  allocator local_4d [13];
  string local_40;
  t_type *local_20;
  t_type *ttype_local;
  t_rs_generator *this_local;
  
  local_20 = ttype;
  ttype_local = (t_type *)this;
  this_local = (t_rs_generator *)__return_storage_ptr__;
  ptVar2 = t_type::get_program(ttype);
  psVar3 = t_program::get_name_abi_cxx11_(ptVar2);
  ptVar2 = t_generator::get_program(&this->super_t_generator);
  __rhs = t_program::get_name_abi_cxx11_(ptVar2);
  bVar1 = std::operator!=(psVar3,__rhs);
  if (bVar1) {
    ptVar2 = t_type::get_program(local_20);
    psVar3 = t_program::get_name_abi_cxx11_(ptVar2);
    rust_snake_case(&local_40,this,psVar3);
    std::operator+(__return_storage_ptr__,&local_40,"::");
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"",local_4d);
    std::allocator<char>::~allocator((allocator<char> *)local_4d);
  }
  return __return_storage_ptr__;
}

Assistant:

string t_rs_generator::rust_namespace(t_type* ttype) {
  if (ttype->get_program()->get_name() != get_program()->get_name()) {
    return rust_snake_case(ttype->get_program()->get_name()) + "::";
  } else {
    return "";
  }
}